

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff.hpp
# Opt level: O0

void __thiscall sf2cute::RIFFChunk::~RIFFChunk(RIFFChunk *this)

{
  RIFFChunk *this_local;
  
  (this->super_RIFFChunkInterface)._vptr_RIFFChunkInterface = (_func_int **)&PTR__RIFFChunk_00163980
  ;
  std::vector<char,_std::allocator<char>_>::~vector(&this->data_);
  std::__cxx11::string::~string((string *)&this->name_);
  RIFFChunkInterface::~RIFFChunkInterface(&this->super_RIFFChunkInterface);
  return;
}

Assistant:

virtual ~RIFFChunk() = default;